

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

Cookie * Curl_cookie_getlist(CookieInfo *c,char *host,char *path,_Bool secure)

{
  char cVar1;
  _Bool _Var2;
  byte bVar3;
  _Bool _Var4;
  int iVar5;
  size_t sVar6;
  size_t __n;
  Cookie *pCVar7;
  char *pcVar8;
  char *__s;
  char *pcVar9;
  size_t sVar10;
  undefined8 *__base;
  undefined8 *puVar11;
  Cookie *pCVar12;
  Cookie *pCVar13;
  size_t sVar14;
  size_t local_50;
  
  sVar6 = cookiehash(host);
  if ((c != (CookieInfo *)0x0) && (c->cookies[sVar6] != (Cookie *)0x0)) {
    pCVar13 = (Cookie *)(c->cookies + sVar6);
    remove_expired(c);
    _Var2 = isip(host);
    local_50 = 0;
    sVar14 = 1;
    pCVar12 = (Cookie *)0x0;
LAB_0046a6bb:
    pCVar13 = pCVar13->next;
    if (pCVar13 != (Cookie *)0x0) {
      if ((byte)(pCVar13->secure ^ 1U | secure) == 1) {
        if (pCVar13->domain != (char *)0x0) {
          bVar3 = pCVar13->tailmatch ^ 1;
          if ((bVar3 & 1) == 0 && !_Var2) {
            _Var4 = tailmatch(pCVar13->domain,host);
            if (_Var4) goto LAB_0046a71f;
            bVar3 = pCVar13->tailmatch ^ 1;
          }
          if (((bVar3 & 1) == 0 && !_Var2) ||
             (iVar5 = Curl_strcasecompare(host,pCVar13->domain), iVar5 == 0)) goto LAB_0046a6bb;
        }
LAB_0046a71f:
        pcVar8 = pCVar13->spath;
        if ((pcVar8 != (char *)0x0) && (__n = strlen(pcVar8), __n != 1)) {
          __s = (*Curl_cstrdup)(path);
          if (__s == (char *)0x0) goto LAB_0046a6bb;
          pcVar9 = strchr(__s,0x3f);
          if (pcVar9 != (char *)0x0) {
            *pcVar9 = '\0';
          }
          if (*__s != '/') {
            (*Curl_cfree)(__s);
            __s = (*Curl_cstrdup)("/");
            if (__s == (char *)0x0) goto LAB_0046a6bb;
          }
          sVar10 = strlen(__s);
          if ((sVar10 < __n) || (iVar5 = strncmp(pcVar8,__s,__n), iVar5 != 0)) {
            (*Curl_cfree)(__s);
            goto LAB_0046a6bb;
          }
          if (__n == sVar10) {
            (*Curl_cfree)(__s);
          }
          else {
            cVar1 = __s[__n];
            (*Curl_cfree)(__s);
            if (cVar1 != '/') goto LAB_0046a6bb;
          }
        }
        pCVar7 = (Cookie *)(*Curl_ccalloc)(0x68,1);
        if (pCVar7 == (Cookie *)0x0) goto LAB_0046a927;
        if (pCVar13->expirestr != (char *)0x0) {
          pcVar8 = (*Curl_cstrdup)(pCVar13->expirestr);
          pCVar7->expirestr = pcVar8;
          if (pcVar8 != (char *)0x0) goto LAB_0046a775;
LAB_0046a91f:
          freecookie(pCVar7);
          goto LAB_0046a927;
        }
LAB_0046a775:
        if (pCVar13->domain != (char *)0x0) {
          pcVar8 = (*Curl_cstrdup)(pCVar13->domain);
          pCVar7->domain = pcVar8;
          if (pcVar8 == (char *)0x0) goto LAB_0046a91f;
        }
        if (pCVar13->path != (char *)0x0) {
          pcVar8 = (*Curl_cstrdup)(pCVar13->path);
          pCVar7->path = pcVar8;
          if (pcVar8 == (char *)0x0) goto LAB_0046a91f;
        }
        if (pCVar13->spath != (char *)0x0) {
          pcVar8 = (*Curl_cstrdup)(pCVar13->spath);
          pCVar7->spath = pcVar8;
          if (pcVar8 == (char *)0x0) goto LAB_0046a91f;
        }
        if (pCVar13->name != (char *)0x0) {
          pcVar8 = (*Curl_cstrdup)(pCVar13->name);
          pCVar7->name = pcVar8;
          if (pcVar8 == (char *)0x0) goto LAB_0046a91f;
        }
        if (pCVar13->value != (char *)0x0) {
          pcVar8 = (*Curl_cstrdup)(pCVar13->value);
          pCVar7->value = pcVar8;
          if (pcVar8 == (char *)0x0) goto LAB_0046a91f;
        }
        if (pCVar13->maxage != (char *)0x0) {
          pcVar8 = (*Curl_cstrdup)(pCVar13->maxage);
          pCVar7->maxage = pcVar8;
          if (pcVar8 == (char *)0x0) goto LAB_0046a91f;
        }
        if (pCVar13->version != (char *)0x0) {
          pcVar8 = (*Curl_cstrdup)(pCVar13->version);
          pCVar7->version = pcVar8;
          if (pcVar8 == (char *)0x0) goto LAB_0046a91f;
        }
        pCVar7->expires = pCVar13->expires;
        pCVar7->tailmatch = pCVar13->tailmatch;
        pCVar7->secure = pCVar13->secure;
        pCVar7->livecookie = pCVar13->livecookie;
        pCVar7->httponly = pCVar13->httponly;
        pCVar7->creationtime = pCVar13->creationtime;
        pCVar7->next = pCVar12;
        local_50 = local_50 + 1;
        pCVar12 = pCVar7;
      }
      goto LAB_0046a6bb;
    }
    if (local_50 == 0) {
      return pCVar12;
    }
    __base = (undefined8 *)(*Curl_cmalloc)(local_50 * 8);
    puVar11 = __base;
    if (__base != (undefined8 *)0x0) {
      for (; pCVar12 != (Cookie *)0x0; pCVar12 = pCVar12->next) {
        *puVar11 = pCVar12;
        puVar11 = puVar11 + 1;
      }
      qsort(__base,local_50,8,cookie_sort);
      pCVar13 = (Cookie *)*__base;
      pCVar12 = pCVar13;
      for (; local_50 != sVar14; sVar14 = sVar14 + 1) {
        pCVar7 = (Cookie *)__base[sVar14];
        pCVar12->next = pCVar7;
        pCVar12 = pCVar7;
      }
      *(undefined8 *)__base[local_50 - 1] = 0;
      (*Curl_cfree)(__base);
      return pCVar13;
    }
LAB_0046a927:
    Curl_cookie_freelist(pCVar12);
  }
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *Curl_cookie_getlist(struct CookieInfo *c,
                                   const char *host, const char *path,
                                   bool secure)
{
  struct Cookie *newco;
  struct Cookie *co;
  struct Cookie *mainco = NULL;
  size_t matches = 0;
  bool is_ip;
  const size_t myhash = cookiehash(host);

  if(!c || !c->cookies[myhash])
    return NULL; /* no cookie struct or no cookies in the struct */

  /* at first, remove expired cookies */
  remove_expired(c);

  /* check if host is an IP(v4|v6) address */
  is_ip = isip(host);

  co = c->cookies[myhash];

  while(co) {
    /* if the cookie requires we're secure we must only continue if we are! */
    if(co->secure?secure:TRUE) {

      /* now check if the domain is correct */
      if(!co->domain ||
         (co->tailmatch && !is_ip && tailmatch(co->domain, host)) ||
         ((!co->tailmatch || is_ip) && strcasecompare(host, co->domain)) ) {
        /* the right part of the host matches the domain stuff in the
           cookie data */

        /* now check the left part of the path with the cookies path
           requirement */
        if(!co->spath || pathmatch(co->spath, path) ) {

          /* and now, we know this is a match and we should create an
             entry for the return-linked-list */

          newco = dup_cookie(co);
          if(newco) {
            /* then modify our next */
            newco->next = mainco;

            /* point the main to us */
            mainco = newco;

            matches++;
          }
          else
            goto fail;
        }
      }
    }
    co = co->next;
  }

  if(matches) {
    /* Now we need to make sure that if there is a name appearing more than
       once, the longest specified path version comes first. To make this
       the swiftest way, we just sort them all based on path length. */
    struct Cookie **array;
    size_t i;

    /* alloc an array and store all cookie pointers */
    array = malloc(sizeof(struct Cookie *) * matches);
    if(!array)
      goto fail;

    co = mainco;

    for(i = 0; co; co = co->next)
      array[i++] = co;

    /* now sort the cookie pointers in path length order */
    qsort(array, matches, sizeof(struct Cookie *), cookie_sort);

    /* remake the linked list order according to the new order */

    mainco = array[0]; /* start here */
    for(i = 0; i<matches-1; i++)
      array[i]->next = array[i + 1];
    array[matches-1]->next = NULL; /* terminate the list */

    free(array); /* remove the temporary data again */
  }

  return mainco; /* return the new list */

fail:
  /* failure, clear up the allocated chain and return NULL */
  Curl_cookie_freelist(mainco);
  return NULL;
}